

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void __thiscall mp3_encoder::Encoder::~Encoder(Encoder *this)

{
  Encoder *this_local;
  
  if (this->m_lameFlags != (lame_global_flags *)0x0) {
    lame_close(this->m_lameFlags);
  }
  std::shared_ptr<unsigned_char>::~shared_ptr(&this->m_mp3Buffer);
  std::shared_ptr<short>::~shared_ptr(&this->m_wavBuffer);
  std::__cxx11::string::~string((string *)&this->m_wavFilePath);
  return;
}

Assistant:

Encoder::~Encoder()
    {
        if (m_lameFlags)
        {
            lame_close(m_lameFlags);
        }
    }